

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtl_sv.c
# Opt level: O3

dtl_error_t dtl_sv_lt(dtl_sv_t *self,dtl_sv_t *other,_Bool *result)

{
  dtl_sv_value_t *pdVar1;
  float fVar2;
  double dVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  dtl_error_t dVar10;
  bool bVar11;
  bool bVar12;
  
  if (result == (_Bool *)0x0 || (other == (dtl_sv_t *)0x0 || self == (dtl_sv_t *)0x0)) {
    return 1;
  }
  *result = false;
  uVar9 = self->u32Flags >> 4 & 0xf;
  dVar10 = 4;
  if (8 < uVar9 - 1) {
    return 4;
  }
  uVar7 = other->u32Flags >> 4 & 0xf;
  switch(uVar9) {
  case 1:
    if (uVar7 != 1) {
      return 4;
    }
    iVar4 = (self->pAny->val).i32;
    iVar8 = (other->pAny->val).i32;
    bVar12 = SBORROW4(iVar4,iVar8);
    bVar11 = iVar4 - iVar8 < 0;
    goto LAB_00105259;
  case 2:
    if (uVar7 != 2) {
      return 4;
    }
    bVar11 = (self->pAny->val).u32 < (other->pAny->val).u32;
    break;
  case 3:
    if (uVar7 != 3) {
      return 4;
    }
    lVar5 = (self->pAny->val).i64;
    lVar6 = (other->pAny->val).i64;
    bVar12 = SBORROW8(lVar5,lVar6);
    bVar11 = lVar5 - lVar6 < 0;
LAB_00105259:
    bVar11 = bVar12 != bVar11;
    break;
  case 4:
    if (uVar7 != 4) {
      return 4;
    }
    bVar11 = (self->pAny->val).u64 < (other->pAny->val).u64;
    break;
  case 5:
    if (uVar7 != 5) {
      return 4;
    }
    fVar2 = (other->pAny->val).flt;
    pdVar1 = &self->pAny->val;
    bVar11 = fVar2 == pdVar1->flt;
    bVar12 = fVar2 < pdVar1->flt;
    goto LAB_0010528a;
  case 6:
    if (uVar7 != 6) {
      return 4;
    }
    dVar3 = (other->pAny->val).dbl;
    pdVar1 = &self->pAny->val;
    bVar11 = dVar3 == pdVar1->dbl;
    bVar12 = dVar3 < pdVar1->dbl;
LAB_0010528a:
    bVar11 = !bVar12 && !bVar11;
    break;
  case 7:
    goto switchD_001051c4_caseD_7;
  case 8:
    if (uVar7 != 8) {
      return 4;
    }
    bVar11 = (self->pAny->val).bl < (other->pAny->val).bl;
    break;
  case 9:
    if (uVar7 != 9) {
      return 4;
    }
    iVar8 = adt_str_lt((self->pAny->val).i64,(other->pAny->val).i64);
    bVar11 = iVar8 != 0;
    if (iVar8 < 0) {
      return 4;
    }
  }
  *result = bVar11;
  dVar10 = 0;
switchD_001051c4_caseD_7:
  return dVar10;
}

Assistant:

dtl_error_t dtl_sv_lt(const dtl_sv_t *self, const dtl_sv_t *other, bool *result)
{
   if ( (self != 0) && (other != 0) && (result != 0) )
   {
      dtl_error_t retval = DTL_TYPE_ERROR;
      dtl_sv_type_id leftType, rightType;
      *result = false;
      leftType = dtl_sv_type(self);
      rightType = dtl_sv_type(other);
      switch(leftType)
      {
      case DTL_SV_NONE:
         retval = DTL_TYPE_ERROR; //cannot compare if None is less than None
         break;
      case DTL_SV_I32:
         if (rightType == DTL_SV_I32)
         {
            *result = self->pAny->val.i32 < other->pAny->val.i32;
            retval = DTL_NO_ERROR;
         }
         break;
      case DTL_SV_U32:
         if (rightType == DTL_SV_U32)
         {
            *result = self->pAny->val.u32 < other->pAny->val.u32;
            retval = DTL_NO_ERROR;
         }
         break;
      case DTL_SV_I64:
         if (rightType == DTL_SV_I64)
         {
            *result = self->pAny->val.i64 < other->pAny->val.i64;
            retval = DTL_NO_ERROR;
         }
         break;
      case DTL_SV_U64:
         if (rightType == DTL_SV_U64)
         {
            *result = self->pAny->val.u64 < other->pAny->val.u64;
            retval = DTL_NO_ERROR;
         }
         break;
      case DTL_SV_FLT:
         if (rightType == DTL_SV_FLT)
         {
            *result = self->pAny->val.flt < other->pAny->val.flt;
            retval = DTL_NO_ERROR;
         }
         break;
      case DTL_SV_DBL:
         if (rightType == DTL_SV_DBL)
         {
            *result = self->pAny->val.dbl < other->pAny->val.dbl;
            retval = DTL_NO_ERROR;
         }
         break;
      case DTL_SV_BOOL:
         if (rightType == DTL_SV_BOOL)
         {
            *result = self->pAny->val.bl < other->pAny->val.bl;
            retval = DTL_NO_ERROR;
         }
         break;
      case DTL_SV_STR:
         if (rightType == DTL_SV_STR)
         {
            int tmp = adt_str_lt(self->pAny->val.str, other->pAny->val.str);
            if (tmp >= 0)
            {
               *result = (bool) tmp;
               retval = DTL_NO_ERROR;
            }
         }
         break;
      case DTL_SV_PTR:
         break;
      case DTL_SV_DV:
         break;
      default:
         retval = DTL_TYPE_ERROR;
      }
      return retval;
   }
   return DTL_INVALID_ARGUMENT_ERROR;
}